

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsfil.cpp
# Opt level: O0

CTcSymbol * CTcSymEnumBase::read_from_sym_file(CVmFile *fp)

{
  tc_symtype_t tVar1;
  char *pcVar2;
  CTcPrsSymtab *this;
  size_t len;
  int is_token;
  char buf [32];
  CTcSymEnum *old_entry;
  char *sym;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  CTcPrsSymtab *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  int copy;
  CVmFile *in_stack_ffffffffffffff80;
  byte local_48;
  CVmFile *in_stack_ffffffffffffffc0;
  CTcSymEnumBase *local_8;
  
  pcVar2 = CTcSymbolBase::base_read_from_sym_file(in_stack_ffffffffffffffc0);
  if (pcVar2 == (char *)0x0) {
    local_8 = (CTcSymEnumBase *)0x0;
  }
  else {
    CVmFile::read_bytes(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                        (size_t)in_stack_ffffffffffffff70);
    this = CTcParser::get_global_symtab(G_prs);
    strlen(pcVar2);
    local_8 = (CTcSymEnumBase *)
              CTcPrsSymtab::find(in_stack_ffffffffffffff70,
                                 (textchar_t *)
                                 CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                                 0x20dc39);
    if ((local_8 == (CTcSymEnumBase *)0x0) ||
       (tVar1 = CTcSymbolBase::get_type((CTcSymbolBase *)local_8), tVar1 != TC_SYM_ENUM)) {
      local_8 = (CTcSymEnumBase *)CTcSymbolBase::operator_new(0x20dc87);
      len = strlen(pcVar2);
      copy = (int)((ulong)pcVar2 >> 0x20);
      pcVar2 = (char *)CTcParser::new_enum_id(G_prs);
      CTcSymEnum::CTcSymEnum
                ((CTcSymEnum *)this,pcVar2,len,copy,(ulong)local_8,in_stack_ffffffffffffff6c);
    }
    else if ((local_48 & 1) != 0) {
      set_is_token(local_8,1);
    }
  }
  return &local_8->super_CTcSymbol;
}

Assistant:

CTcSymbol *CTcSymEnumBase::read_from_sym_file(CVmFile *fp)
{
    const char *sym;
    CTcSymEnum *old_entry;
    char buf[32];
    int is_token;

    /* read the symbol name */
    if ((sym = base_read_from_sym_file(fp)) == 0)
        return 0;

    /* read the 'token' flag */
    fp->read_bytes(buf, 1);
    is_token = ((buf[0] & 1) != 0);

    /* 
     *   If this enumerator is already defined, this is a harmless
     *   redefinition - every symbol file can define the same enumerator
     *   without any problem.  Indicate the harmless redefinition by
     *   returning the original symbol.  
     */
    old_entry = (CTcSymEnum *)
                G_prs->get_global_symtab()->find(sym, strlen(sym));
    if (old_entry != 0 && old_entry->get_type() == TC_SYM_ENUM)
    {
        /* if this is a 'token' enum, mark the old entry as such */
        if (is_token)
            old_entry->set_is_token(TRUE);

        /* return the original entry */
        return old_entry;
    }

    /* create and return the new symbol */
    return new CTcSymEnum(sym, strlen(sym), FALSE,
                          G_prs->new_enum_id(), is_token);
}